

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdirlisting.cpp
# Opt level: O0

bool __thiscall
QDirListingPrivate::matchesFilters(QDirListingPrivate *this,QDirEntryInfo *entryInfo)

{
  long lVar1;
  QStringView fileName_00;
  bool bVar2;
  QFlags<QDirListing::IteratorFlag> *pQVar3;
  long in_RDI;
  long in_FS_OFFSET;
  QString *fileName;
  IteratorFlag in_stack_ffffffffffffff2c;
  undefined6 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff36;
  undefined1 in_stack_ffffffffffffff37;
  QDirEntryInfo *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  QString *in_stack_ffffffffffffff48;
  undefined5 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff55;
  undefined1 in_stack_ffffffffffffff56;
  undefined1 in_stack_ffffffffffffff57;
  storage_type_conflict *in_stack_ffffffffffffff58;
  bool local_45;
  QFlags<QDirListing::IteratorFlag> local_44;
  QFlags<QDirListing::IteratorFlag> local_40;
  QFlags<QDirListing::IteratorFlag> local_3c;
  QFlags<QDirListing::IteratorFlag> local_38;
  QFlags<QDirListing::IteratorFlag> local_34;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QDirEntryInfo::fileName(in_stack_ffffffffffffff38);
  bVar2 = QString::isEmpty((QString *)0x294cd4);
  if (bVar2) {
    local_45 = false;
    goto LAB_00295077;
  }
  QStringView::QStringView<QString,_true>
            ((QStringView *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
             (QString *)in_stack_ffffffffffffff38);
  fileName_00.m_size._5_1_ = in_stack_ffffffffffffff55;
  fileName_00.m_size._0_5_ = in_stack_ffffffffffffff50;
  fileName_00.m_size._6_1_ = in_stack_ffffffffffffff56;
  fileName_00.m_size._7_1_ = in_stack_ffffffffffffff57;
  fileName_00.m_data = in_stack_ffffffffffffff58;
  bVar2 = isDotOrDotDot(fileName_00);
  if (bVar2) {
    QFlags<QDirListing::IteratorFlag>::QFlags
              ((QFlags<QDirListing::IteratorFlag> *)
               CONCAT17(in_stack_ffffffffffffff37,
                        CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)),
               in_stack_ffffffffffffff2c);
    local_45 = QFlags<QDirListing::IteratorFlag>::testAnyFlags
                         ((QFlags<QDirListing::IteratorFlag> *)(in_RDI + 0xa0),local_34);
    goto LAB_00295077;
  }
  bVar2 = regexMatchesName((QDirListingPrivate *)
                           CONCAT17(in_stack_ffffffffffffff57,
                                    CONCAT16(in_stack_ffffffffffffff56,
                                             CONCAT15(in_stack_ffffffffffffff55,
                                                      in_stack_ffffffffffffff50))),
                           in_stack_ffffffffffffff48);
  if (!bVar2) {
    local_45 = false;
    goto LAB_00295077;
  }
  bVar2 = QFlags<QDirListing::IteratorFlag>::testAnyFlag
                    ((QFlags<QDirListing::IteratorFlag> *)
                     CONCAT17(in_stack_ffffffffffffff37,
                              CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)),
                     in_stack_ffffffffffffff2c);
  if ((!bVar2) &&
     (bVar2 = QDirEntryInfo::isHidden
                        ((QDirEntryInfo *)
                         CONCAT17(in_stack_ffffffffffffff37,
                                  CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30))),
     bVar2)) {
    local_45 = false;
    goto LAB_00295077;
  }
  bVar2 = QDirEntryInfo::isSymLink
                    ((QDirEntryInfo *)
                     CONCAT17(in_stack_ffffffffffffff37,
                              CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)));
  if (bVar2) {
    bVar2 = QFlags<QDirListing::IteratorFlag>::testAnyFlag
                      ((QFlags<QDirListing::IteratorFlag> *)
                       CONCAT17(in_stack_ffffffffffffff37,
                                CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)),
                       in_stack_ffffffffffffff2c);
    if (!bVar2) {
      QFlags<QDirListing::IteratorFlag>::QFlags
                ((QFlags<QDirListing::IteratorFlag> *)
                 CONCAT17(in_stack_ffffffffffffff37,
                          CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)),
                 in_stack_ffffffffffffff2c);
      bVar2 = QFlags<QDirListing::IteratorFlag>::testAnyFlags
                        ((QFlags<QDirListing::IteratorFlag> *)(in_RDI + 0xa0),local_38);
      if (!bVar2) {
        pQVar3 = (QFlags<QDirListing::IteratorFlag> *)(in_RDI + 0xa0);
        QFlags<QDirListing::IteratorFlag>::QFlags
                  ((QFlags<QDirListing::IteratorFlag> *)
                   CONCAT17(in_stack_ffffffffffffff37,
                            CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)),
                   in_stack_ffffffffffffff2c);
        bVar2 = QFlags<QDirListing::IteratorFlag>::testAnyFlags(pQVar3,local_3c);
        if (!bVar2) goto LAB_00294f0f;
      }
      local_45 = false;
      goto LAB_00295077;
    }
    bVar2 = QDirEntryInfo::exists
                      ((QDirEntryInfo *)
                       CONCAT17(in_stack_ffffffffffffff37,
                                CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)));
    if (!bVar2) {
      local_45 = false;
      goto LAB_00295077;
    }
  }
LAB_00294f0f:
  bVar2 = QFlags<QDirListing::IteratorFlag>::testAnyFlag
                    ((QFlags<QDirListing::IteratorFlag> *)
                     CONCAT17(in_stack_ffffffffffffff37,
                              CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)),
                     in_stack_ffffffffffffff2c);
  if ((((!bVar2) ||
       (bVar2 = QDirEntryInfo::isFile
                          ((QDirEntryInfo *)
                           CONCAT17(in_stack_ffffffffffffff37,
                                    CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30))),
       bVar2)) ||
      (bVar2 = QDirEntryInfo::isDir
                         ((QDirEntryInfo *)
                          CONCAT17(in_stack_ffffffffffffff37,
                                   CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30))),
      bVar2)) ||
     (bVar2 = QDirEntryInfo::isSymLink
                        ((QDirEntryInfo *)
                         CONCAT17(in_stack_ffffffffffffff37,
                                  CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30))),
     bVar2)) {
    pQVar3 = (QFlags<QDirListing::IteratorFlag> *)(in_RDI + 0xa0);
    QFlags<QDirListing::IteratorFlag>::QFlags
              ((QFlags<QDirListing::IteratorFlag> *)
               CONCAT17(in_stack_ffffffffffffff37,
                        CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)),
               in_stack_ffffffffffffff2c);
    bVar2 = QFlags<QDirListing::IteratorFlag>::testAnyFlags(pQVar3,local_40);
    if ((bVar2) &&
       (bVar2 = QDirEntryInfo::isDir
                          ((QDirEntryInfo *)
                           CONCAT17(in_stack_ffffffffffffff37,
                                    CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30))),
       bVar2)) {
      local_45 = false;
    }
    else {
      pQVar3 = (QFlags<QDirListing::IteratorFlag> *)(in_RDI + 0xa0);
      QFlags<QDirListing::IteratorFlag>::QFlags
                ((QFlags<QDirListing::IteratorFlag> *)
                 CONCAT17(in_stack_ffffffffffffff37,
                          CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)),
                 in_stack_ffffffffffffff2c);
      bVar2 = QFlags<QDirListing::IteratorFlag>::testAnyFlags(pQVar3,local_44);
      if ((bVar2) &&
         (bVar2 = QDirEntryInfo::isFile
                            ((QDirEntryInfo *)
                             CONCAT17(in_stack_ffffffffffffff37,
                                      CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30))
                            ), bVar2)) {
        local_45 = false;
      }
      else {
        local_45 = true;
      }
    }
  }
  else {
    local_45 = false;
  }
LAB_00295077:
  QString::~QString((QString *)0x295084);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_45;
}

Assistant:

bool QDirListingPrivate::matchesFilters(QDirEntryInfo &entryInfo) const
{
    using F = QDirListing::IteratorFlag;

    const QString &fileName = entryInfo.fileName();
    if (fileName.isEmpty())
        return false;

    if (isDotOrDotDot(fileName)) // All done, other checks below don't matter in this case
        return iteratorFlags.testAnyFlags(F::IncludeDotAndDotDot);

    // name filter
#if QT_CONFIG(regularexpression)
    if (!regexMatchesName(fileName))
        return false;
#endif // QT_CONFIG(regularexpression)

    if (!iteratorFlags.testAnyFlag(F::IncludeHidden) && entryInfo.isHidden())
        return false;

    if (entryInfo.isSymLink()) {
        // With ResolveSymlinks, we look at the type of the link's target,
        // and exclude broken symlinks (where the target doesn't exist).
        if (iteratorFlags.testAnyFlag(F::ResolveSymlinks)) {
            if (!entryInfo.exists())
                return false;
        } else if (iteratorFlags.testAnyFlags(F::FilesOnly)
                   || iteratorFlags.testAnyFlags(F::DirsOnly)) {
            return false; // symlink is not a file or dir
        }
    }

    if (iteratorFlags.testAnyFlag(F::ExcludeOther)
        && !entryInfo.isFile() && !entryInfo.isDir() && !entryInfo.isSymLink()) {
        return false;
    }

    if (iteratorFlags.testAnyFlags(F::ExcludeDirs) && entryInfo.isDir())
        return false;

    if (iteratorFlags.testAnyFlags(F::ExcludeFiles) && entryInfo.isFile())
        return false;

    return true;
}